

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void __thiscall FSlide::SlideTraverse(FSlide *this,DVector2 *start,DVector2 *end)

{
  int iVar1;
  line_t *line;
  AActor *pAVar2;
  bool bVar3;
  uint uVar4;
  intercept_t *piVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double savedz;
  FPathTraverse it;
  FLineOpening open;
  DVector2 local_118;
  FPathTraverse local_100;
  FLineOpening local_c0;
  
  local_100._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_00872258;
  FPathTraverse::init(&local_100,(EVP_PKEY_CTX *)0x1);
  do {
    while( true ) {
      while( true ) {
        piVar5 = FPathTraverse::Next(&local_100);
        if (piVar5 == (intercept_t *)0x0) goto LAB_0053df07;
        if (piVar5->isaline != false) break;
        Printf("PTR_SlideTraverse: not a line?");
      }
      line = (piVar5->d).line;
      uVar4 = line->flags;
      if (((uVar4 & 4) == 0) || (line->backsector == (sector_t *)0x0)) break;
      if ((((uVar4 & 0x8001) != 0) ||
          ((pAVar2 = this->slidemo, (uVar4 >> 0xe & 1) != 0 && (pAVar2->player != (player_t *)0x0)))
          ) || (((uVar4 & 2) != 0 &&
                ((((pAVar2->flags3).Value & 0x100000) == 0 &&
                 (((i_compatflags._3_1_ & 4) == 0 || (((pAVar2->flags).Value & 0x8000000) == 0))))))
               )) goto LAB_0053dee3;
      local_118.X = piVar5->frac * local_100.trace.dx + local_100.trace.x;
      local_118.Y = piVar5->frac * local_100.trace.dy + local_100.trace.y;
      P_LineOpening(&local_c0,pAVar2,line,&local_118,(DVector2 *)0x0,0);
      pAVar2 = this->slidemo;
      if ((local_c0.range < pAVar2->Height) ||
         ((dVar7 = (pAVar2->__Pos).Z, local_c0.top < pAVar2->Height + dVar7 ||
          (pAVar2->MaxStepHeight <= local_c0.bottom - dVar7 &&
           local_c0.bottom - dVar7 != pAVar2->MaxStepHeight)))) goto LAB_0053dee3;
      if (dVar7 < local_c0.bottom) {
        (pAVar2->__Pos).Z = local_c0.bottom;
        bVar3 = P_TestMobjZ(pAVar2,true,(AActor **)0x0);
        (this->slidemo->__Pos).Z = dVar7;
        if (!bVar3) goto LAB_0053dee3;
      }
    }
    pAVar2 = this->slidemo;
    iVar6 = pAVar2->Sector->PortalGroup;
    iVar1 = line->frontsector->PortalGroup;
    dVar7 = 0.0;
    dVar8 = 0.0;
    if (iVar6 != iVar1) {
      iVar6 = iVar1 * Displacements.size + iVar6;
      dVar7 = Displacements.data.Array[iVar6].pos.X;
      dVar8 = Displacements.data.Array[iVar6].pos.Y;
    }
    dVar7 = dVar7 + (pAVar2->__Pos).X;
    dVar8 = dVar8 + (pAVar2->__Pos).Y;
    if (((byte)i_compatflags2 & 8) == 0) {
      uVar4 = (uint)(1.52587890625e-05 <
                    (line->delta).Y * ((line->v1->p).X - dVar7) +
                    (line->delta).X * (dVar8 - (line->v1->p).Y));
    }
    else {
      uVar4 = P_VanillaPointOnLineSide(dVar7,dVar8,line);
    }
  } while (uVar4 != 0);
LAB_0053dee3:
  dVar7 = piVar5->frac;
  if (dVar7 < this->bestSlidefrac) {
    this->secondSlidefrac = this->bestSlidefrac;
    this->secondslideline = this->bestslideline;
    this->bestSlidefrac = dVar7;
    this->bestslideline = line;
  }
LAB_0053df07:
  FPathTraverse::~FPathTraverse(&local_100);
  return;
}

Assistant:

void FSlide::SlideTraverse(const DVector2 &start, const DVector2 &end)
{
	FLineOpening open;
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{
		line_t* 	li;

		if (!in->isaline)
		{
			// should never happen
			Printf("PTR_SlideTraverse: not a line?");
			continue;
		}

		li = in->d.line;

		if (!(li->flags & ML_TWOSIDED) || !li->backsector)
		{
			DVector3 pos = slidemo->PosRelative(li);
			if (P_PointOnLineSide(pos, li))
			{
				// don't hit the back side
				continue;
			}
			goto isblocking;
		}
		if (li->flags & (ML_BLOCKING | ML_BLOCKEVERYTHING))
		{
			goto isblocking;
		}
		if (li->flags & ML_BLOCK_PLAYERS && slidemo->player != NULL)
		{
			goto isblocking;
		}
		if (li->flags & ML_BLOCKMONSTERS && !((slidemo->flags3 & MF3_NOBLOCKMONST)
			|| ((i_compatflags & COMPATF_NOBLOCKFRIENDS) && (slidemo->flags & MF_FRIENDLY))))
		{
			goto isblocking;
		}

		// set openrange, opentop, openbottom
		P_LineOpening(open, slidemo, li, it.InterceptPoint(in));

		if (open.range < slidemo->Height)
			goto isblocking;				// doesn't fit

		if (open.top < slidemo->Top())
			goto isblocking;				// mobj is too high

		if (open.bottom - slidemo->Z() > slidemo->MaxStepHeight)
		{
			goto isblocking;				// too big a step up
		}
		else if (slidemo->Z() < open.bottom)
		{ // [RH] Check to make sure there's nothing in the way for the step up
			double savedz = slidemo->Z();
			slidemo->SetZ(open.bottom);
			bool good = P_TestMobjZ(slidemo);
			slidemo->SetZ(savedz);
			if (!good)
			{
				goto isblocking;
			}
		}

		// this line doesn't block movement
		continue;

		// the line does block movement,
		// see if it is closer than best so far
	isblocking:
		if (in->frac < bestSlidefrac)
		{
			secondSlidefrac = bestSlidefrac;
			secondslideline = bestslideline;
			bestSlidefrac = in->frac;
			bestslideline = li;
		}

		return;		// stop
	}
}